

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::UInt64Field::UInt64Field(UInt64Field *this,int field,uint64_t data)

{
  string local_40;
  uint64_t local_20;
  uint64_t data_local;
  UInt64Field *pUStack_10;
  int field_local;
  UInt64Field *this_local;
  
  local_20 = data;
  data_local._4_4_ = field;
  pUStack_10 = this;
  IntTConvertor<unsigned_long>::convert_abi_cxx11_
            (&local_40,(IntTConvertor<unsigned_long> *)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__UInt64Field_00330ca0;
  return;
}

Assistant:

explicit UInt64Field(int field, uint64_t data)
      : FieldBase(field, UInt64Convertor::convert(data)) {}